

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O1

state_status_t
tchecker::ta::initialize
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
          sync_id_t *sync_id,clock_constraint_container_t *invariant,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  intval_t *intval_00;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar1;
  state_status_t sVar2;
  integer_t iVar3;
  mapped_type *str;
  bytecode_t *bytecode;
  char *__function;
  ulong uVar4;
  long lVar5;
  key_type local_50;
  
  sVar2 = syncprod::initialize(&system->super_system_t,vloc,vedge,sync_id,attributes);
  if (sVar2 != 1) {
    return sVar2;
  }
  intval_00 = &intval->_t->super_intval_t;
  if (intval_00 != (intval_t *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"intval","");
    str = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(attributes,&local_50);
    from_string(intval_00,
                &(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
                 super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._flattened_variables,str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pmVar1 = vloc->_t;
    if (pmVar1 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
      __function = 
      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
      ;
      goto LAB_001a5a98;
    }
    uVar4 = (ulong)(pmVar1->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                   super_array_capacity_t<unsigned_int>._capacity;
    if (uVar4 == 0) {
      return 1;
    }
    lVar5 = 0;
    while( true ) {
      bytecode = system_t::invariant_bytecode
                           (system,*(loc_id_t *)
                                    (&(pmVar1->super_vloc_t).super_loc_array_t._fam.field_0x0 +
                                    lVar5));
      if (&intval->_t->super_intval_t == (intval_t *)0x0) break;
      iVar3 = vm_t::run(&system->_vm,bytecode,&intval->_t->super_intval_t,invariant,
                        (clock_reset_container_t *)&place_holder_clkreset);
      if (iVar3 == 0) {
        return 8;
      }
      if (place_holder_clkreset != DAT_0024d8c8) {
        __assert_fail("place_holder_clkreset.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x15c,
                      "tchecker::state_status_t tchecker::ta::initialize(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const std::map<std::string, std::string> &)"
                     );
      }
      lVar5 = lVar5 + 4;
      if (uVar4 << 2 == lVar5) {
        return 1;
      }
    }
  }
  __function = 
  "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::intval_t>]"
  ;
LAB_001a5a98:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,__function);
}

Assistant:

tchecker::state_status_t initialize(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                    tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                                    tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                                    std::map<std::string, std::string> const & attributes)
{
  // intialize vloc and vedge from syncprod
  auto status = tchecker::syncprod::initialize(system.as_syncprod_system(), vloc, vedge, sync_id, attributes);
  if (status != STATE_OK)
    return status;

  // initialize intval
  try {
    tchecker::from_string(*intval, system.integer_variables().flattened(), attributes.at("intval"));
  }
  catch (...) {
    return tchecker::STATE_BAD;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_SRC_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}